

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>(WasmBytecodeGenerator *this)

{
  TypedRegisterAllocator *this_00;
  uint index;
  WasmType WVar1;
  WasmSignature *this_01;
  IWasmByteCodeWriter *pIVar2;
  code *pcVar3;
  bool bVar4;
  ProfileId PVar5;
  ArgSlot AVar6;
  uint16 uVar7;
  ArgSlot AVar8;
  Local LVar9;
  undefined4 uVar10;
  uint uVar11;
  RegSlot RVar12;
  RegSlot tmpReg;
  EmitInfoBase EVar13;
  AsmJsRetType AVar14;
  undefined4 *puVar15;
  WasmBinaryReader *pWVar16;
  WasmFunctionInfo *pWVar17;
  EmitInfo *obj;
  EmitInfo EVar18;
  RegisterSpace *pRVar19;
  WasmRegisterSpace *pWVar20;
  EmitInfo EVar21;
  WasmCompilationException *pWVar22;
  Type TVar23;
  uint32 i_1;
  uint32 uVar24;
  ulong uVar25;
  ulong uVar26;
  WasmType WVar27;
  WebAssemblyModule *this_02;
  ulong uVar28;
  uint32 i;
  uint uVar29;
  undefined8 uVar30;
  ulong count;
  PolymorphicEmitInfo PVar31;
  EmitInfo local_b8;
  EmitInfo indirectIndexInfo;
  undefined1 local_a0 [8];
  PolymorphicEmitInfo retInfo;
  WasmType local_58;
  byte local_40;
  ushort local_34;
  anon_class_1_0_00000001 local_31 [5];
  ArgSlot args;
  anon_class_1_0_00000001 argOverflow;
  
  local_b8.super_EmitInfoBase.location = 0xffffffff;
  local_b8.type = Void;
  pWVar16 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar16 == (WasmBinaryReader *)0x0) {
    TVar23 = (((this->m_module->m_reader).ptr)->super_WasmReaderBase).m_currentNode.field_1.call.
             funcType;
    if (TVar23 == Function) {
      local_58 = Void;
    }
    else {
      local_58 = FirstLocalType;
      if (TVar23 != Import) goto LAB_00d72884;
    }
LAB_00d7290b:
    this_02 = this->m_module;
    pWVar16 = (this_02->m_reader).ptr;
  }
  else {
    TVar23 = (pWVar16->super_WasmReaderBase).m_currentNode.field_1.call.funcType;
    if (TVar23 == Function) {
      local_58 = Void;
    }
    else {
      local_58 = FirstLocalType;
      if (TVar23 != Import) {
LAB_00d72884:
        if (TVar23 != ImportThunk) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar15 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                             ,0x449,
                             "(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk)"
                             ,
                             "isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk"
                            );
          if (!bVar4) goto LAB_00d730bb;
          *puVar15 = 0;
          pWVar16 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
        }
        local_58 = Void;
        if (pWVar16 == (WasmBinaryReader *)0x0) goto LAB_00d7290b;
      }
    }
    this_02 = this->m_module;
  }
  index = (pWVar16->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
  pWVar17 = Js::WebAssemblyModule::GetWasmFunctionInfo(this_02,index);
  pWVar16 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar16 == (WasmBinaryReader *)0x0) {
    pWVar16 = (this->m_module->m_reader).ptr;
  }
  this_01 = (pWVar17->m_signature).ptr;
  PVar5 = 0xffff;
  if (((pWVar16->super_WasmReaderBase).m_currentNode.field_1.call.funcType == Function) &&
     (bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmInOutPhase), !bVar4)) {
    PVar5 = GetNextProfileId(this);
  }
  local_40 = (byte)local_58;
  if (local_40 == 0) {
    AVar6 = WasmSignature::GetParamsSize(this_01);
    uVar30 = 0x1c;
  }
  else {
    AVar6 = WasmSignature::GetParamCount(this_01);
    if (0x1fff < AVar6) {
      EmitCall<(Wasm::WasmOp)16>::anon_class_1_0_00000001::operator()(local_31);
    }
    AVar6 = AVar6 << 3;
    uVar30 = 0x11;
  }
  uVar7 = UInt16Math::
          Add<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>()::_lambda()_1_const>
                    (AVar6,8,local_31);
  if ((uVar7 & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x478,"((0))","Wasm argument size should always be Var aligned");
    if (!bVar4) {
LAB_00d730bb:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar15 = 0;
    pWVar22 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(pWVar22,L"Internal Error");
    goto LAB_00d730a5;
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1f])(this->m_writer,uVar30,(ulong)uVar7,0);
  AVar6 = WasmSignature::GetParamCount(this_01);
  indirectIndexInfo = (EmitInfo)&this->m_alloc;
  count = (ulong)AVar6;
  obj = Memory::AllocateArray<Memory::ArenaAllocator,Wasm::EmitInfo,false>
                  ((Memory *)indirectIndexInfo,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                   count);
  for (uVar25 = count; 0 < (long)uVar25; uVar25 = uVar25 - 1) {
    LVar9 = WasmSignature::GetParam(this_01,(short)uVar25 - 1);
    EVar18 = PopEvalStack(this,LVar9,L"Call argument does not match formal type");
    obj[uVar25 - 1] = EVar18;
  }
  puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_58 = local_58 ^ 0x145;
  bVar4 = local_40 != 0;
  retInfo.field_1.singleInfo.type = 0x21;
  if (bVar4) {
    retInfo.field_1.singleInfo.type = 0x15;
  }
  WVar27 = 0x20;
  if (bVar4) {
    WVar27 = 0x14;
  }
  uVar29 = 0x22;
  if (bVar4) {
    uVar29 = 0x16;
  }
  uVar25 = 1;
  uVar26 = 0;
LAB_00d72abe:
  if (count == uVar26) goto LAB_00d72c26;
  WVar1 = obj[uVar26].type;
  if (7 < WVar1 - FirstLocalType) {
switchD_00d72afc_caseD_6:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    pWVar22 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (pWVar22,L"Unknown argument type %u",(ulong)WVar1);
    __cxa_throw(pWVar22,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  uVar11 = obj[uVar26].super_EmitInfoBase.location;
  uVar28 = (ulong)uVar29;
  switch(WVar1) {
  case FirstLocalType:
    uVar10 = WVar27;
    break;
  case I64:
    uVar10 = retInfo.field_1.singleInfo.type;
    break;
  case F32:
    goto switchD_00d72afc_caseD_3;
  case F64:
    uVar10 = (uint)(local_40 ^ 1) * 8 + 0x17;
    break;
  case V128:
    Simd::EnsureSimdIsEnabled();
    uVar10 = local_58;
    break;
  default:
    goto switchD_00d72afc_caseD_6;
  case Any:
    uVar28 = 0x14;
    if (this->isUnreachable != false) goto switchD_00d72afc_caseD_3;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x4a6,"(IsUnreachable())","IsUnreachable()");
    if (!bVar4) goto LAB_00d730bb;
    *puVar15 = 0;
    if ((this->isUnreachable & 1U) == 0) goto switchD_00d72afc_caseD_6;
    goto switchD_00d72afc_caseD_3;
  }
  uVar28 = (ulong)(uint)uVar10;
switchD_00d72afc_caseD_3:
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
            (this->m_writer,uVar28 & 0xffff,uVar25,(ulong)uVar11);
  uVar11 = 1;
  if (local_40 == 0) {
    AVar8 = WasmSignature::GetParamSize(this_01,(ArgSlot)uVar26);
    if ((AVar8 & 7) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar15 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x4bc,"(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)))",
                         "Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var))");
      if (!bVar4) goto LAB_00d730bb;
      *puVar15 = 0;
    }
    uVar11 = (uint)(AVar8 >> 3);
  }
  uVar25 = (ulong)((int)uVar25 + uVar11);
  uVar26 = uVar26 + 1;
  goto LAB_00d72abe;
LAB_00d72c26:
  this_00 = &this->mTypedRegisterAllocator;
  uVar24 = 1;
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
  RVar12 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar19);
  if (local_40 == 0) {
    uVar24 = this->m_module->m_importedFunctionCount + 1;
  }
  uVar24 = UInt32Math::Add(uVar24,index);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x18])
            (this->m_writer,0x4e,(ulong)RVar12,1,(ulong)uVar24);
  local_a0._0_4_ = 0;
  retInfo.count = 0;
  retInfo._4_4_ = 0;
  PolymorphicEmitInfo::Init
            ((PolymorphicEmitInfo *)local_a0,this_01->m_resultsCount,
             (ArenaAllocator *)indirectIndexInfo);
  for (uVar29 = 0; uVar29 < this_01->m_resultsCount; uVar29 = uVar29 + 1) {
    LVar9 = WasmSignature::GetResult(this_01,uVar29);
    PolymorphicEmitInfo::SetInfo
              ((PolymorphicEmitInfo *)local_a0,(EmitInfo)(((ulong)LVar9 << 0x20) + 0xffffffff),
               uVar29);
  }
  if (local_40 == 0) {
    pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
    WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar19,RVar12);
    ReleaseLocation(this,&local_b8);
    for (uVar25 = (ulong)((uint)AVar6 * 8); uVar25 != 0; uVar25 = uVar25 - 8) {
      ReleaseLocation(this,(EmitInfo *)((long)&obj[-1].super_EmitInfoBase.location + uVar25));
    }
    for (uVar29 = 0; uVar29 < this_01->m_resultsCount; uVar29 = uVar29 + 1) {
      LVar9 = WasmSignature::GetResult(this_01,uVar29);
      pWVar20 = GetRegisterSpace(this,LVar9);
      EVar13.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar20);
      EVar18.type = LVar9;
      EVar18.super_EmitInfoBase.location = EVar13.location;
      PolymorphicEmitInfo::SetInfo((PolymorphicEmitInfo *)local_a0,EVar18,uVar29);
    }
    if (local_a0._0_4_ == 0) {
      WVar27 = Void;
      EVar21.super_EmitInfoBase.location = 0xffffffff;
      EVar21.type = ~Void;
    }
    else {
      EVar21 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_a0,0);
      WVar27 = EVar21.type;
    }
    pIVar2 = this->m_writer;
    local_34 = uVar7 >> 3;
    AVar14 = WasmToAsmJs::GetAsmJsReturnType(WVar27);
    (*pIVar2->_vptr_IWasmByteCodeWriter[0x20])
              (pIVar2,0x1d,(ulong)EVar21 & 0xffffffff,(ulong)RVar12,(ulong)(uVar7 >> 3),
               (ulong)AVar14.which_,(uint)PVar5);
    goto LAB_00d72fb8;
  }
  local_34 = WasmSignature::GetParamCount(this_01);
  UInt16Math::Inc<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>()::_lambda()_1_const>
            (&local_34,local_31);
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
  tmpReg = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar19);
  uVar29 = this_01->m_resultsCount;
  if (1 < uVar29) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar15 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x4e8,"(calleeSignature->GetResultCount() <= 1)",
                       "Multiple results from function imports not supported");
    if (!bVar4) goto LAB_00d730bb;
    *puVar15 = 0;
    uVar29 = this_01->m_resultsCount;
  }
  if (uVar29 == 0) {
    uVar25 = 0;
  }
  else {
    LVar9 = WasmSignature::GetResult(this_01,0);
    uVar25 = (ulong)LVar9;
  }
  pIVar2 = this->m_writer;
  uVar26 = (ulong)local_34;
  WVar27 = (WasmType)uVar25;
  AVar14 = WasmToAsmJs::GetAsmJsReturnType(WVar27);
  (*pIVar2->_vptr_IWasmByteCodeWriter[0x20])
            (pIVar2,0x12,(ulong)tmpReg,(ulong)RVar12,uVar26,(ulong)AVar14.which_,(uint)PVar5);
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar19,tmpReg);
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar19,RVar12);
  ReleaseLocation(this,&local_b8);
  for (uVar26 = (ulong)((uint)AVar6 * 8); uVar26 != 0; uVar26 = uVar26 - 8) {
    ReleaseLocation(this,(EmitInfo *)((long)&obj[-1].super_EmitInfoBase.location + uVar26));
  }
  if (this_01->m_resultsCount == 0) goto LAB_00d72fb8;
  switch(WVar27) {
  case FirstLocalType:
    uVar30 = 0x18;
    break;
  case I64:
    uVar30 = 0x1b;
    break;
  case F32:
    uVar30 = 0x19;
    break;
  case F64:
    uVar30 = 0x1a;
    break;
  case V128:
    pWVar22 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (pWVar22,L"Return type: v128 not supported in import calls");
    goto LAB_00d730a5;
  default:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    pWVar22 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (pWVar22,L"Unknown call return type %u",uVar25);
LAB_00d730a5:
    __cxa_throw(pWVar22,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  pWVar20 = GetRegisterSpace(this,WVar27);
  RVar12 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar20);
  PolymorphicEmitInfo::SetInfo
            ((PolymorphicEmitInfo *)local_a0,(EmitInfo)((ulong)RVar12 | uVar25 << 0x20),0);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])(this->m_writer,uVar30,(ulong)RVar12,tmpReg);
LAB_00d72fb8:
  Memory::DeleteArray<Memory::ArenaAllocator,Wasm::EmitInfo>
            ((AllocatorType *)indirectIndexInfo,count,obj);
  if (this->m_maxArgOutDepth <= (uint)local_34) {
    this->m_maxArgOutDepth = local_34 + 1;
  }
  PVar31._4_4_ = 0;
  PVar31.count = local_a0._0_4_;
  PVar31.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)retInfo._0_8_;
  return PVar31;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitCall()
{
    uint32 funcNum = Js::Constants::UninitializedValue;
    uint32 signatureId = Js::Constants::UninitializedValue;
    WasmSignature* calleeSignature = nullptr;
    Js::ProfileId profileId = Js::Constants::NoProfileId;
    EmitInfo indirectIndexInfo;
    const bool isImportCall = GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Import;
    Assert(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk);
    switch (wasmOp)
    {
    case wbCall:
    {
        funcNum = GetReader()->m_currentNode.call.num;
        WasmFunctionInfo* calleeInfo = m_module->GetWasmFunctionInfo(funcNum);
        calleeSignature = calleeInfo->GetSignature();
        // currently only handle inlining internal function calls
        // in future we can expand to all calls by adding checks in inliner and falling back to call in case ScriptFunction doesn't match
        if (GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function && !PHASE_TRACE1(Js::WasmInOutPhase))
        {
            profileId = GetNextProfileId();
        }
        break;
    }
    case wbCallIndirect:
        indirectIndexInfo = PopEvalStack(WasmTypes::I32, _u("Indirect call index must be int type"));
        signatureId = GetReader()->m_currentNode.call.num;
        calleeSignature = m_module->GetSignature(signatureId);
        break;
    default:
        Assume(UNREACHED);
    }

    const auto argOverflow = []
    {
        throw WasmCompilationException(_u("Argument size too big"));
    };

    // emit start call
    Js::ArgSlot argSize;
    Js::OpCodeAsmJs startCallOp;
    if (isImportCall)
    {
        argSize = ArgSlotMath::Mul(calleeSignature->GetParamCount(), sizeof(Js::Var), argOverflow);
        startCallOp = Js::OpCodeAsmJs::StartCall;
    }
    else
    {
        startCallOp = Js::OpCodeAsmJs::I_StartCall;
        argSize = calleeSignature->GetParamsSize();
    }
    // Add return value
    argSize = ArgSlotMath::Add(argSize, sizeof(Js::Var), argOverflow);
    if (!Math::IsAligned<Js::ArgSlot>(argSize, sizeof(Js::Var)))
    {
        AssertMsg(UNREACHED, "Wasm argument size should always be Var aligned");
        throw WasmCompilationException(_u("Internal Error"));
    }

    m_writer->AsmStartCall(startCallOp, argSize);

    Js::ArgSlot nArgs = calleeSignature->GetParamCount();

    // copy args into a list so they could be generated in the right order (FIFO)
    EmitInfo* argsList = AnewArray(&m_alloc, EmitInfo, nArgs);
    for (int i = int(nArgs) - 1; i >= 0; --i)
    {
        EmitInfo info = PopEvalStack(calleeSignature->GetParam((Js::ArgSlot)i), _u("Call argument does not match formal type"));
        // We can release the location of the arguments now, because we won't create new temps between start/call
        argsList[i] = info;
    }

    // Skip the this pointer (aka undefined)
    uint32 argLoc = 1;
    for (Js::ArgSlot i = 0; i < nArgs; ++i)
    {
        EmitInfo info = argsList[i];

        Js::OpCodeAsmJs argOp = Js::OpCodeAsmJs::Nop;
        switch (info.type)
        {
        case WasmTypes::F32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Flt : Js::OpCodeAsmJs::I_ArgOut_Flt;
            break;
        case WasmTypes::F64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Db : Js::OpCodeAsmJs::I_ArgOut_Db;
            break;
        case WasmTypes::I32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Int : Js::OpCodeAsmJs::I_ArgOut_Int;
            break;
        case WasmTypes::I64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Long : Js::OpCodeAsmJs::I_ArgOut_Long;
            break;
#ifdef ENABLE_WASM_SIMD
        case WasmTypes::V128:
            Simd::EnsureSimdIsEnabled();
            argOp = isImportCall ? Js::OpCodeAsmJs::Simd128_ArgOut_F4 : Js::OpCodeAsmJs::Simd128_I_ArgOut_F4;
            break;
#endif
        case WasmTypes::Any:
            // In unreachable mode allow any type as argument since we won't actually emit the call
            Assert(IsUnreachable());
            if (IsUnreachable())
            {
                argOp = Js::OpCodeAsmJs::ArgOut_Int;
                break;
            }
            // Fall through
        default:
            WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
            throw WasmCompilationException(_u("Unknown argument type %u"), info.type);
        }

        m_writer->AsmReg2(argOp, argLoc, info.location);

        // Calculated next argument Js::Var location
        if (isImportCall)
        {
            ++argLoc;
        }
        else
        {
            const Js::ArgSlot currentArgSize = calleeSignature->GetParamSize(i);
            Assert(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)));
            argLoc += currentArgSize / sizeof(Js::Var);
        }
    }

    Js::RegSlot funcReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();

    // emit call
    switch (wasmOp)
    {
    case wbCall:
    {
        uint32 offset = isImportCall ? m_module->GetImportFuncOffset() : m_module->GetFuncOffset();
        uint32 index = UInt32Math::Add(offset, funcNum);
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlot, funcReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, index);
        break;
    }
    case wbCallIndirect:
    {
        Js::RegSlot slotReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlotArr, slotReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, m_module->GetTableEnvironmentOffset());
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdArr_WasmFunc, funcReg, slotReg, indirectIndexInfo.location);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(slotReg);
        m_writer->AsmReg1IntConst1(Js::OpCodeAsmJs::CheckSignature, funcReg, calleeSignature->GetSignatureId());
        break;
    }
    default:
        Assume(UNREACHED);
    }

    // calculate number of RegSlots(Js::Var) the call consumes
    PolymorphicEmitInfo retInfo;
    retInfo.Init(calleeSignature->GetResultCount(), &m_alloc);
    for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
    {
        retInfo.SetInfo(EmitInfo(calleeSignature->GetResult(i)), i);
    }
    Js::ArgSlot args;
    if (isImportCall)
    {
        args = calleeSignature->GetParamCount();
        ArgSlotMath::Inc(args, argOverflow);

        Js::RegSlot varRetReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        AssertOrFailFastMsg(calleeSignature->GetResultCount() <= 1, "Multiple results from function imports not supported");
        WasmTypes::WasmType singleResType = calleeSignature->GetResultCount() > 0 ? calleeSignature->GetResult(0) : WasmTypes::Void;
        m_writer->AsmCall(Js::OpCodeAsmJs::Call, varRetReg, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResType), profileId);

        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(varRetReg);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);

        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        // emit result coercion
        if (calleeSignature->GetResultCount() > 0)
        {
            Js::OpCodeAsmJs convertOp = Js::OpCodeAsmJs::Nop;
            switch (singleResType)
            {
            case WasmTypes::F32:
                convertOp = Js::OpCodeAsmJs::Conv_VTF;
                break;
            case WasmTypes::F64:
                convertOp = Js::OpCodeAsmJs::Conv_VTD;
                break;
            case WasmTypes::I32:
                convertOp = Js::OpCodeAsmJs::Conv_VTI;
                break;
            case WasmTypes::I64:
                convertOp = Js::OpCodeAsmJs::Conv_VTL;
                break;
#ifdef ENABLE_WASM_SIMD
            case WasmTypes::V128:
                throw WasmCompilationException(_u("Return type: v128 not supported in import calls"));
#endif
            default:
                WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
                throw WasmCompilationException(_u("Unknown call return type %u"), singleResType);
            }
            Js::RegSlot location = GetRegisterSpace(singleResType)->AcquireTmpRegister();
            retInfo.SetInfo(EmitInfo(location, singleResType), 0);
            m_writer->AsmReg2(convertOp, location, varRetReg);
        }
    }
    else
    {
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);
        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
        {
            EmitInfo info(calleeSignature->GetResult(i));
            info.location = GetRegisterSpace(info.type)->AcquireTmpRegister();
            retInfo.SetInfo(info, i);
        }

        EmitInfo singleResultInfo = retInfo.Count() > 0 ? retInfo.GetInfo(0) : EmitInfo(WasmTypes::Void);
        args = (Js::ArgSlot)(::ceil((double)(argSize / sizeof(Js::Var))));
        // todo:: add bytecode to call and set aside multi results
        m_writer->AsmCall(Js::OpCodeAsmJs::I_Call, singleResultInfo.location, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResultInfo.type), profileId);
    }
    AdeleteArray(&m_alloc, nArgs, argsList);

    // WebAssemblyArrayBuffer is not detachable, no need to check for detached state here

    // track stack requirements for out params

    // + 1 for return address
    uint32 maxDepthForLevel = args + 1;
    if (maxDepthForLevel > m_maxArgOutDepth)
    {
        m_maxArgOutDepth = maxDepthForLevel;
    }

    return retInfo;
}